

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RAWToYJRow_C(uint8_t *src_argb0,uint8_t *dst_y,int width)

{
  byte bVar1;
  long lVar2;
  
  if (0 < width) {
    lVar2 = 0;
    do {
      bVar1 = src_argb0[2];
      dst_y[lVar2] = (uint8_t)((uint)src_argb0[1] * 0x96 + (uint)*src_argb0 * 0x4d +
                               (uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 + 0x80 >> 8);
      lVar2 = lVar2 + 1;
      src_argb0 = src_argb0 + 3;
    } while (width != (int)lVar2);
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}